

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_168b90f::HighBDConvolveHorizRSTest::RunOne
          (HighBDConvolveHorizRSTest *this,bool ref)

{
  byte bVar1;
  int src_stride_00;
  int iVar2;
  int in_length;
  int out_length;
  int dst_stride_00;
  int w;
  int32_t h;
  unsigned_short *puVar3;
  unsigned_short *src_00;
  int unaff_EBX;
  byte in_SIL;
  long in_RDI;
  int unaff_R14D;
  int32_t x_step_qn;
  int x0_qn;
  int height;
  int width_dst;
  int width_src;
  int dst_stride;
  int src_stride;
  uint16_t *dst;
  uint16_t *src;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffe0;
  int x0_qn_00;
  long lVar4;
  
  bVar1 = in_SIL & 1;
  lVar4 = in_RDI;
  puVar3 = TestImage<unsigned_short>::GetSrcData
                     ((TestImage<unsigned_short> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
  x0_qn_00 = (int)lVar4;
  src_00 = TestImage<unsigned_short>::GetDstData
                     ((TestImage<unsigned_short> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
  src_stride_00 =
       TestImage<unsigned_short>::src_stride(*(TestImage<unsigned_short> **)(in_RDI + 0x18));
  iVar2 = TestImage<unsigned_short>::dst_stride(*(TestImage<unsigned_short> **)(in_RDI + 0x18));
  in_length = TestImage<unsigned_short>::src_width(*(TestImage<unsigned_short> **)(in_RDI + 0x18));
  out_length = TestImage<unsigned_short>::dst_width(*(TestImage<unsigned_short> **)(in_RDI + 0x18));
  dst_stride_00 = TestImage<unsigned_short>::height(*(TestImage<unsigned_short> **)(in_RDI + 0x18));
  w = TestImage<unsigned_short>::x0(*(TestImage<unsigned_short> **)(in_RDI + 0x18));
  h = av1_get_upscale_convolve_step(in_length,out_length);
  if ((bVar1 & 1) == 0) {
    (**(code **)(in_RDI + 0x28))
              (puVar3,src_stride_00,src_00,iVar2,out_length,dst_stride_00,
               av1_resize_filter_normative,w,h,*(undefined4 *)(in_RDI + 0x10));
  }
  else {
    av1_highbd_convolve_horiz_rs_c
              (src_00,src_stride_00,(uint16_t *)CONCAT44(in_length,out_length),dst_stride_00,w,h,
               (int16_t *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),x0_qn_00,unaff_EBX,unaff_R14D);
  }
  return;
}

Assistant:

void RunOne(bool ref) override {
    const uint16_t *src = image_->GetSrcData(ref, false);
    uint16_t *dst = image_->GetDstData(ref, false);
    const int src_stride = image_->src_stride();
    const int dst_stride = image_->dst_stride();
    const int width_src = image_->src_width();
    const int width_dst = image_->dst_width();
    const int height = image_->height();
    const int x0_qn = image_->x0();

    const int32_t x_step_qn =
        av1_get_upscale_convolve_step(width_src, width_dst);

    if (ref) {
      av1_highbd_convolve_horiz_rs_c(
          src, src_stride, dst, dst_stride, width_dst, height,
          &av1_resize_filter_normative[0][0], x0_qn, x_step_qn, bd_);
    } else {
      tst_fun_(src, src_stride, dst, dst_stride, width_dst, height,
               &av1_resize_filter_normative[0][0], x0_qn, x_step_qn, bd_);
    }
  }